

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O3

void __thiscall
cmDebugServerConsole::cmDebugServerConsole(cmDebugServerConsole *this,cmDebugger *debugger)

{
  cmConnection *conn;
  cmConnectionBufferStrategy *bufferStrategy;
  
  conn = (cmConnection *)operator_new(0x48);
  bufferStrategy = (cmConnectionBufferStrategy *)operator_new(8);
  bufferStrategy->_vptr_cmConnectionBufferStrategy =
       (_func_int **)&PTR__cmConnectionBufferStrategy_006f2d08;
  cmStdIoConnection::cmStdIoConnection((cmStdIoConnection *)conn,bufferStrategy);
  cmDebugServer::cmDebugServer(&this->super_cmDebugServer,debugger,conn);
  (this->super_cmDebugServer).super_cmServerBase._vptr_cmServerBase =
       (_func_int **)&PTR__cmDebugServerConsole_006f2c38;
  (this->super_cmDebugServer).super_cmDebuggerListener._vptr_cmDebuggerListener =
       (_func_int **)&PTR__cmDebugServerConsole_006f2cb8;
  this->PrintPrompt = true;
  return;
}

Assistant:

cmDebugServerConsole::cmDebugServerConsole(cmDebugger& debugger)
  : cmDebugServerConsole(debugger,
                         new cmStdIoConnection(new cmLineBufferStrategy()))
{
}